

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

__sighandler_t __thiscall
obs::signal<void_(int)>::~signal(signal<void_(int)> *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  __sighandler_t extraout_RAX;
  slot_list *this_00;
  iterator __begin0;
  iterator __end0;
  iterator iStack_68;
  iterator local_40;
  
  (this->super_signal_base)._vptr_signal_base = (_func_int **)&PTR__signal_00106c90;
  this_00 = &this->m_slots;
  safe_list<obs::slot<void_(int)>_>::begin(&iStack_68,this_00);
  safe_list<obs::slot<void_(int)>_>::end(&local_40,this_00);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int)>_>::iterator::operator!=(&iStack_68,&local_40);
    if (!bVar1) {
      safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&local_40);
      safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&iStack_68);
      safe_list<obs::slot<void_(int)>_>::~safe_list(this_00);
      return extraout_RAX;
    }
    if ((iStack_68.m_node == (node *)0x0) || (iStack_68.m_locked == false)) break;
    if (iStack_68.m_value != (slot<void_(int)> *)0x0) {
      (*((iStack_68.m_value)->super_slot_base)._vptr_slot_base[1])();
    }
    safe_list<obs::slot<void_(int)>_>::iterator::operator++(&iStack_68);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<void (int)>>::iterator::operator*() const [T = obs::slot<void (int)>]"
               );
}

Assistant:

~signal() {
    for (auto slot : m_slots)
      delete slot;
  }